

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithScript_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithScript_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  pointer *ppuVar2;
  pointer puVar3;
  bool bVar4;
  char *message;
  undefined1 *puVar5;
  long lVar6;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  AssertionResult gtest_ar;
  SigHashType sighash_type;
  OutPoint outpoint2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign2;
  ByteData256 sighash;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  OutPoint outpoint1;
  ElementsAddressFactory factory;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  ByteData signature1;
  ByteData signature2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SignParameter sign1;
  ConfidentialTransactionContext txc;
  Address address;
  UtxoData utxo2;
  Address asset_address;
  UtxoData utxo3;
  UtxoData utxo1;
  AssertHelper local_23f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_23f0;
  AssertHelper local_23e8;
  SigHashType local_23dc [12];
  OutPoint local_23d0;
  ByteData local_23a8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2390;
  Pubkey local_2378;
  void *local_2358;
  undefined **local_2330;
  undefined1 *local_2320;
  undefined1 local_2310 [16];
  undefined1 local_2300 [48];
  OutPoint local_22d0;
  undefined **local_22a8 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  local_2298 [24];
  undefined1 local_2280 [48];
  ByteData256 local_2250;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2238;
  SigHashType local_2220 [12];
  SigHashType local_2214 [12];
  SigHashType local_2208 [12];
  SigHashType local_21fc [12];
  Pubkey local_21f0;
  void *local_21d0;
  undefined **local_21a8;
  undefined1 *local_2198;
  undefined1 local_2188 [16];
  OutPoint local_2178 [4];
  undefined1 **local_20c0 [2];
  undefined1 *local_20b0 [2];
  undefined1 local_20a0 [16];
  void *local_2090;
  void *local_2078;
  void *local_2060;
  code *local_2048 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1fd0;
  Script local_1fb8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f78;
  undefined1 local_1f48 [48];
  undefined1 local_1f18 [24];
  void *local_1f00;
  void *local_1ee8;
  code *local_1ed0 [13];
  undefined1 local_1e68 [16];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1e58;
  Script local_1e40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e00 [19];
  UtxoData local_1a58 [1264];
  UtxoData local_1568 [1264];
  undefined1 *local_1078 [2];
  undefined1 local_1068 [24];
  Txid local_1050;
  uint local_1030;
  Script local_1028;
  Script local_ff0;
  Address local_fb8 [376];
  undefined1 local_e40 [8];
  char *local_e38;
  undefined1 local_e20 [664];
  allocator_type local_b88 [16];
  undefined1 *local_b78;
  undefined1 local_b68 [16];
  void *local_b58;
  void *local_b40;
  void *local_b28;
  code *local_b10 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a98;
  Script local_a80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a40;
  undefined1 *local_a10 [2];
  undefined1 local_a00 [24];
  Txid local_9e8;
  uint local_9c8;
  Script local_9c0 [8];
  undefined1 local_7d8 [8];
  char *local_7d0;
  undefined1 local_7b8 [664];
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0;
  Script local_498;
  Address local_460 [376];
  undefined1 local_2e8 [8];
  char *local_2e0;
  undefined1 local_2c8 [664];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)local_22a8,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2c8._24_8_ = (pointer)0x0;
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)local_1078);
  cfd::core::Txid::operator=(&local_4f8,(Txid *)local_1f48);
  local_1f48._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  local_4d8 = 0;
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,
             "0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)local_1078);
  cfd::core::Script::operator=(&local_4d0,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)local_1078);
  cfd::core::Script::operator=(&local_498,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,"ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2",
             "");
  cfd::AddressFactory::GetAddress((string *)local_1f48);
  cfd::core::Address::operator=(local_460,(Address *)local_1f48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1e00);
  cfd::core::Script::~Script(&local_1e40);
  local_1ed0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e58)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1ed0);
  if (local_1ee8 != (void *)0x0) {
    operator_delete(local_1ee8);
  }
  if (local_1f00 != (void *)0x0) {
    operator_delete(local_1f00);
  }
  if ((pointer)local_1f18._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f18._0_8_);
  }
  if ((string *)local_1f48._16_8_ != (string *)(local_1f48 + 0x20)) {
    operator_delete((void *)local_1f48._16_8_);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_2e8,0,local_2e0,0x24c9fe);
  cfd::core::Amount::Amount((Amount *)local_1f48,10000000);
  local_2c8[8] = local_1f48[8];
  local_2c8._0_8_ = local_1f48._0_8_;
  local_2c8._16_4_ = 3;
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)local_1078);
  cfd::core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(local_2c8 + 0x20),(ConfidentialAssetId *)local_1f48);
  local_1f48._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f48,(string *)local_1078);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_1f48 + 0x18),(string *)local_a10);
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f18,(string *)local_20c0);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1f48;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_2390,__l,local_b88);
  lVar6 = 0x30;
  do {
    if (*(void **)(local_1f48 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_1f48 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0]);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
  cfd::core::Privkey::FromWif((string *)local_1f48,(NetType)local_1078,true);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt","");
  cfd::core::Privkey::FromWif((string *)(local_1f48 + 0x20),(NetType)local_a10,true);
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9","");
  cfd::core::Privkey::FromWif((string *)(local_1f18 + 0x10),(NetType)local_20c0,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1f48;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)(local_2300 + 0x18),
             __l_00,(allocator_type *)local_b88);
  lVar6 = 0x60;
  do {
    if (*(void **)(local_1f48 + lVar6 + -0x20) != (void *)0x0) {
      operator_delete(*(void **)(local_1f48 + lVar6 + -0x20));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != 0);
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0]);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0]);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1078);
  local_1078[0] = (undefined1 *)0x0;
  local_e20._24_8_ = (pointer)0x0;
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             "");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)local_a10);
  cfd::core::Txid::operator=(&local_1050,(Txid *)local_1f48);
  local_1f48._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_1030 = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)local_1f48,(vector *)0x2,SUB81(&local_2390,0));
  cfd::core::Script::operator=(&local_ff0,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  cfd::AddressFactory::CreateP2shAddress((Script *)local_1f48);
  cfd::core::Address::operator=(local_fb8,(Address *)local_1f48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1e00);
  cfd::core::Script::~Script(&local_1e40);
  local_1ed0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e58)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1ed0);
  if (local_1ee8 != (void *)0x0) {
    operator_delete(local_1ee8);
  }
  if (local_1f00 != (void *)0x0) {
    operator_delete(local_1f00);
  }
  if ((pointer)local_1f18._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f18._0_8_);
  }
  if ((string *)local_1f48._16_8_ != (string *)(local_1f48 + 0x20)) {
    operator_delete((void *)local_1f48._16_8_);
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::operator=(&local_1028,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  std::__cxx11::string::_M_replace((ulong)local_e40,0,local_e38,0x24cb3a);
  cfd::core::Amount::Amount((Amount *)local_1f48,180000);
  local_e20[8] = local_1f48[8];
  local_e20._0_8_ = local_1f48._0_8_;
  local_e20._16_4_ = 5;
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)local_a10);
  cfd::core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(local_e20 + 0x20),(ConfidentialAssetId *)local_1f48);
  local_1f48._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_a10);
  local_a10[0] = (undefined1 *)0x0;
  local_7b8._24_8_ = (pointer)0x0;
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)local_20c0);
  cfd::core::Txid::operator=(&local_9e8,(Txid *)local_1f48);
  local_1f48._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0]);
  }
  local_9c8 = 2;
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20c0,"51","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)local_20c0);
  cfd::core::Script::operator=(local_9c0,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_7d8,0,local_7d0,0x24cc15);
  cfd::core::Amount::Amount((Amount *)local_1f48,10000);
  local_7b8[8] = local_1f48[8];
  local_7b8._0_8_ = local_1f48._0_8_;
  local_7b8._16_4_ = 1;
  local_20c0[0] = local_20b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)local_20c0);
  cfd::core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(local_7b8 + 0x20),(ConfidentialAssetId *)local_1f48);
  local_1f48._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f48._8_8_);
  }
  if (local_20c0[0] != local_20b0) {
    operator_delete(local_20c0[0]);
  }
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1f48 + 0x10);
  local_1f48._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,"2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6","");
  cfd::AddressFactory::GetAddress((string *)local_20c0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_1f48._0_8_);
  }
  local_1f48._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z","");
  cfd::AddressFactory::GetAddress((string *)local_b88);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_1f48._0_8_);
  }
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2178,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)local_1f48,(UtxoData *)local_520);
  cfd::UtxoData::UtxoData(local_1a58,(UtxoData *)local_1078);
  cfd::UtxoData::UtxoData(local_1568,(UtxoData *)local_a10);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1f48;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2238,__l_01,(allocator_type *)&local_2378);
  lVar6 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1f48 + lVar6));
    lVar6 = lVar6 + -0x4f0;
  } while (lVar6 != -0x4f0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::AddInputs((vector *)local_2178);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x36f,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_2178,(Amount *)local_20c0,(ConfidentialAssetId *)local_2c8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_2178,(Amount *)local_b88,(ConfidentialAssetId *)local_e20);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_2178,(ConfidentialAssetId *)local_7b8);
  cfd::core::ByteData::ByteData(&local_23a8);
  cfd::core::OutPoint::OutPoint(&local_22d0,&local_4f8,local_4d8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1f48._0_8_ = sVar1.ptr_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f48,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_23d0,(string *)local_1f48);
    ppuVar2 = (pointer *)
              ((long)&local_21f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)ppuVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_21f0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
    cfd::core::Privkey::FromWif((string *)&local_2378,(NetType)&local_21f0,true);
    cfd::core::SigHashType::SigHashType(local_21fc);
    cfd::ConfidentialTransactionContext::SignWithKey
              (local_2178,&local_22d0,&local_23d0,&local_2378,local_21fc,1);
    if (local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2378.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
      operator_delete(local_21f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_23d0.txid_._vptr_Txid != (_func_int **)0x0) {
      operator_delete(local_23d0.txid_._vptr_Txid);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_1f48._0_8_);
    }
  }
  testing::Message::Message((Message *)local_1f48);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37c,
             "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Verify(local_2178);
  }
  testing::Message::Message((Message *)local_1f48);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37e,
             "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::IgnoreVerify(local_2178);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37f,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  cfd::core::OutPoint::OutPoint(&local_23d0,&local_1050,local_1030);
  cfd::core::SigHashType::SigHashType(local_23dc);
  cfd::core::SigHashType::SigHashType(local_2208,local_23dc);
  cfd::ConfidentialTransactionContext::CreateSignatureHash
            (local_1f48,local_2178,&local_23d0,&local_ff0,local_2208,local_e20,0);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_2300,(ByteData *)local_1f48);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_1f48._0_8_);
  }
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2250,(Privkey *)local_2300,(bool)(local_2300[0x18] + '@'));
  cfd::core::SignatureUtil::CalculateEcSignature
            ((ByteData256 *)(local_2280 + 0x18),(Privkey *)local_2300,(bool)(local_2300[0x18] + ' ')
            );
  cfd::core::SigHashType::SigHashType(local_2214,local_23dc);
  cfd::SignParameter::SignParameter((SignParameter *)&local_2378,&local_2250,1,local_2214);
  cfd::SignParameter::SetRelatedPubkey(&local_2378);
  cfd::core::SigHashType::SigHashType(local_2220,local_23dc);
  cfd::SignParameter::SignParameter((SignParameter *)&local_21f0,local_2280 + 0x18,1,local_2220);
  cfd::SignParameter::SetRelatedPubkey(&local_21f0);
  cfd::SignParameter::SignParameter((SignParameter *)local_1f48,(SignParameter *)&local_2378);
  cfd::SignParameter::SignParameter((SignParameter *)local_1ed0,(SignParameter *)&local_21f0);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1f48;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_2280,__l_02,
             (allocator_type *)&local_23f8);
  lVar6 = -0xf0;
  puVar5 = local_1e68;
  do {
    *(undefined ***)(puVar5 + -0x20) = &PTR__ScriptOperator_002db7b0;
    if (puVar5 != *(undefined1 **)(puVar5 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x10));
    }
    if (*(void **)(puVar5 + -0x48) != (void *)0x0) {
      operator_delete(*(void **)(puVar5 + -0x48));
    }
    if (*(void **)(puVar5 + -0x68) != (void *)0x0) {
      operator_delete(*(void **)(puVar5 + -0x68));
    }
    puVar5 = puVar5 + -0x78;
    lVar6 = lVar6 + 0x78;
  } while (lVar6 != 0);
  cfd::ConfidentialTransactionContext::AddMultisigSign
            (local_2178,(vector *)&local_23d0,(Script *)local_2280,(AddressType)&local_ff0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Verify(local_2178);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_23f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x38f,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_23f8,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1f48,&local_9e8,local_9c8);
      cfd::ConfidentialTransactionContext::Verify(local_2178);
      local_1f48._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_1f48._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f48._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_23f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x392,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_23f8,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Verify();
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_23f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x394,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_23f8,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Finalize();
      puVar3 = local_23a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_23a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1f48._0_8_;
      local_23a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1f48._8_8_;
      local_23a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1f48._16_8_;
      local_1f48._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1f48._8_8_ = (pointer)0x0;
      local_1f48._16_8_ = (string *)0x0;
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar3 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(puVar3);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1f48._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_1f48._0_8_);
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_23f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x396,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_23f8,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_23f8,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000\""
             ,(char *)local_1f48._0_8_,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000"
            );
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_1f48._0_8_);
  }
  if (local_23f8.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1f48);
    if (local_23f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_23f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_23e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x397,message);
    testing::internal::AssertHelper::operator=(&local_23e8,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1f48._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1f48._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_2280);
  local_21a8 = &PTR__ScriptOperator_002db7b0;
  if (local_2198 != local_2188) {
    operator_delete(local_2198);
  }
  if (local_21d0 != (void *)0x0) {
    operator_delete(local_21d0);
  }
  if ((pointer *)
      local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_21f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2330 = &PTR__ScriptOperator_002db7b0;
  if (local_2320 != local_2310) {
    operator_delete(local_2320);
  }
  if (local_2358 != (void *)0x0) {
    operator_delete(local_2358);
  }
  if (local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_2280._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_2280._24_8_);
  }
  if (local_2250.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2250.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_2300._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2300._0_8_);
  }
  local_23d0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002dbe60;
  if (local_23d0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23d0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_22d0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002dbe60;
  if (local_22d0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_22d0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_23a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_23a8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2238);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a40);
  cfd::core::Script::~Script(&local_a80);
  local_b10[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a98);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_b10);
  if (local_b28 != (void *)0x0) {
    operator_delete(local_b28);
  }
  if (local_b40 != (void *)0x0) {
    operator_delete(local_b40);
  }
  if (local_b58 != (void *)0x0) {
    operator_delete(local_b58);
  }
  if (local_b78 != local_b68) {
    operator_delete(local_b78);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f78);
  cfd::core::Script::~Script(&local_1fb8);
  local_2048[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd0)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_2048);
  if (local_2060 != (void *)0x0) {
    operator_delete(local_2060);
  }
  if (local_2078 != (void *)0x0) {
    operator_delete(local_2078);
  }
  if (local_2090 != (void *)0x0) {
    operator_delete(local_2090);
  }
  if (local_20b0[0] != local_20a0) {
    operator_delete(local_20b0[0]);
  }
  cfd::UtxoData::~UtxoData((UtxoData *)local_a10);
  cfd::UtxoData::~UtxoData((UtxoData *)local_1078);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)(local_2300 + 0x18))
  ;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_2390);
  cfd::UtxoData::~UtxoData((UtxoData *)local_520);
  local_22a8[0] = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_2298);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithScript)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address = factory.GetAddress("2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  Address asset_address = factory.GetAddress("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z");

  ConfidentialTransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount, utxo1.asset);
  txc.AddTxOut(asset_address, utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(utxo3.amount, utxo3.asset);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000");
}